

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O1

void __thiscall
rsg::ComputeLessOrEqualRange::operator()
          (ComputeLessOrEqualRange *this,Random *rnd,bool dstMin,bool dstMax,int *aMin,int *aMax,
          int *bMin,int *bMax)

{
  int iVar1;
  uint uVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  
  dVar3 = deRandom_getUint32(&rnd->m_rnd);
  dVar4 = deRandom_getUint32(&rnd->m_rnd);
  iVar6 = dVar4 % 9 - 4;
  iVar1 = iVar6 + dVar3 % 9;
  if (dstMax && !dstMin) {
    *aMin = iVar6;
    *aMax = iVar1;
  }
  else {
    dVar4 = deRandom_getUint32(&rnd->m_rnd);
    uVar2 = dVar4 % (9 - dVar3 % 9);
    if (dstMin && dstMax) {
      *aMax = iVar6;
      iVar5 = iVar6 - uVar2;
    }
    else {
      *aMin = iVar1 + 1;
      iVar5 = uVar2 + iVar1 + 1;
      aMin = aMax;
    }
    *aMin = iVar5;
  }
  *bMin = iVar6;
  *bMax = iVar1;
  return;
}

Assistant:

void ComputeLessOrEqualRange::operator () (de::Random& rnd, bool dstMin, bool dstMax, T& aMin, T& aMax, T& bMin, T& bMax) const
{
	struct GetRandom
	{
		int		operator() (de::Random& random, int min, int max) const		{ return random.getInt(min, max); }
		float	operator() (de::Random& random, float min, float max) const	{ return getQuantizedFloat(random, min, max, getStep<float>()); }
	};

	// One random range
	T	rLen	= GetRandom()(rnd, T(0), T(8));
	T	rMin	= GetRandom()(rnd, T(-4), T(4));
	T	rMax	= rMin+rLen;

	if (dstMin == false && dstMax == true)
	{
		// Both values are possible, use same range for both inputs
		aMin	= rMin;
		aMax	= rMax;
		bMin	= rMin;
		bMax	= rMax;
	}
	else if (dstMin == true && dstMax == true)
	{
		// Compute range that is less than or equal to rMin..rMax
		T aLen = GetRandom()(rnd, T(0), T(8)-rLen);

		aMax	= rMin;
		aMin	= aMax - aLen;

		bMin	= rMin;
		bMax	= rMax;
	}
	else
	{
		// Compute range that is greater than rMin..rMax
		T aLen = GetRandom()(rnd, T(0), T(8)-rLen);

		aMin	= rMax + getStep<T>();
		aMax	= aMin + aLen;

		bMin	= rMin;
		bMax	= rMax;
	}
}